

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acbp_v1.cpp
# Opt level: O2

void __thiscall intel_acbp_v1_t::hash_t::~hash_t(hash_t *this)

{
  ~hash_t(this);
  operator_delete(this);
  return;
}

Assistant:

intel_acbp_v1_t::hash_t::~hash_t() {
    _clean_up();
}